

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  undefined1 *puVar2;
  ushort uVar3;
  size_t sVar4;
  size_t sVar5;
  BrotliEncoderDictionary *pBVar6;
  void *pvVar7;
  HasherCommon *pHVar8;
  PreparedDictionary *pPVar9;
  void *pvVar10;
  BrotliDictionary *pBVar11;
  undefined8 uVar12;
  byte bVar13;
  BrotliEncoderParams *pBVar14;
  BrotliEncoderParams *pBVar15;
  uint uVar16;
  uint32_t uVar17;
  uint32_t *addr_1;
  BrotliEncoderParams *pBVar18;
  ulong *puVar19;
  long lVar20;
  ulong uVar21;
  BrotliEncoderParams *pBVar22;
  undefined1 *puVar23;
  BrotliEncoderParams *pBVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  BrotliEncoderParams *pBVar28;
  BrotliEncoderParams *pBVar29;
  ulong *puVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined8 *puVar34;
  int iVar35;
  BrotliEncoderParams *pBVar36;
  BrotliEncoderParams *pBVar37;
  ulong *puVar38;
  BrotliEncoderParams *pBVar39;
  uint16_t uVar40;
  int iVar41;
  ulong uVar42;
  uint *puVar43;
  ulong uVar44;
  byte bVar45;
  BrotliEncoderParams *pBVar46;
  long lVar47;
  BrotliEncoderParams *pBVar48;
  long lVar49;
  undefined1 *puVar50;
  uint uVar51;
  BrotliEncoderParams *pBVar52;
  ulong *puVar53;
  ulong *puVar54;
  BrotliEncoderParams *pBVar55;
  ulong uVar56;
  ulong uVar57;
  uint8_t *s1_orig_2;
  size_t sVar58;
  BrotliEncoderParams *pBVar59;
  size_t sVar60;
  bool bVar61;
  int iVar62;
  BrotliEncoderParams *local_170;
  ulong local_168;
  BrotliEncoderParams *local_160;
  BrotliEncoderParams *local_150;
  BrotliEncoderParams *local_148;
  BrotliEncoderParams *local_140;
  size_t local_130;
  BrotliEncoderParams *local_120;
  BrotliEncoderParams *local_118;
  BrotliEncoderParams *local_100;
  BrotliEncoderParams *local_e0;
  Command *local_d0;
  ulong local_b0;
  uint local_9c;
  uint8_t *s1_orig_1;
  uint8_t *s1_orig_6;
  BankH42 *banks_1;
  
  iVar35 = params->lgwin;
  sVar4 = params->stream_offset;
  local_130 = *last_insert_len;
  pBVar18 = (BrotliEncoderParams *)((position - 3) + num_bytes);
  if (num_bytes < 4) {
    pBVar18 = (BrotliEncoderParams *)position;
  }
  puVar2 = (undefined1 *)(position + num_bytes);
  lVar49 = 0x200;
  if (params->quality < 9) {
    lVar49 = 0x40;
  }
  sVar5 = (params->dictionary).compound.total_size;
  iVar62 = (int)*(undefined8 *)dist_cache;
  iVar41 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  dist_cache[4] = iVar62 + -1;
  dist_cache[5] = iVar62 + 1;
  dist_cache[6] = iVar62 + -2;
  dist_cache[7] = iVar62 + 2;
  dist_cache[8] = iVar62 + -3;
  dist_cache[9] = iVar62 + 3;
  dist_cache[10] = iVar41 + -1;
  dist_cache[0xb] = iVar41 + 1;
  dist_cache[0xc] = iVar41 + -2;
  dist_cache[0xd] = iVar41 + 2;
  dist_cache[0xe] = iVar41 + -3;
  dist_cache[0xf] = iVar41 + 3;
  if ((undefined1 *)(position + 4) < puVar2) {
    pBVar36 = (BrotliEncoderParams *)((1L << ((byte)iVar35 & 0x3f)) + -0x10);
    pBVar59 = (BrotliEncoderParams *)(lVar49 + position);
    lVar1 = sVar5 + 1;
    local_d0 = commands;
    pBVar24 = (BrotliEncoderParams *)position;
    local_148 = pBVar59;
    do {
      pBVar48 = pBVar36;
      if (pBVar24 < pBVar36) {
        pBVar48 = pBVar24;
      }
      pBVar28 = (BrotliEncoderParams *)
                ((long)(pBVar24->dictionary).compound.chunks + (sVar4 - 0x68));
      if (pBVar36 <= pBVar28) {
        pBVar28 = pBVar36;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_9c = 0;
        local_b0 = 0;
      }
      else {
        if (pBVar24 == (BrotliEncoderParams *)0x0) {
          local_b0 = 0;
        }
        else {
          local_b0 = (ulong)ringbuffer[(ulong)&pBVar24[-1].dictionary.field_0x527 & ringbuffer_mask]
          ;
        }
        if (pBVar24 < (BrotliEncoderParams *)0x2) {
          uVar42 = 0;
        }
        else {
          uVar42 = (ulong)ringbuffer[(ulong)&pBVar24[-1].dictionary.field_0x526 & ringbuffer_mask];
        }
        local_9c = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar42 + 0x100] | literal_context_lut[local_b0]];
      }
      local_150 = (BrotliEncoderParams *)(puVar2 + -(long)pBVar24);
      pBVar6 = (params->dictionary).contextual.dict[local_9c];
      pBVar22 = (BrotliEncoderParams *)(params->dist).max_distance;
      pBVar55 = (BrotliEncoderParams *)(hasher->privat)._H42.extra[0];
      pvVar7 = (hasher->privat)._H42.extra[1];
      uVar42 = (ulong)pBVar24 & ringbuffer_mask;
      puVar19 = (ulong *)(ringbuffer + uVar42);
      uVar26 = (uint)(*(int *)(ringbuffer + uVar42) * 0x1e35a7bd) >> 0x11;
      local_160 = (BrotliEncoderParams *)0x7e4;
      pBVar37 = (BrotliEncoderParams *)0x0;
      lVar20 = 0;
      local_120 = (BrotliEncoderParams *)0x0;
      local_e0 = (BrotliEncoderParams *)0x0;
      pBVar39 = (BrotliEncoderParams *)0x7e4;
      do {
        pBVar46 = (BrotliEncoderParams *)(long)dist_cache[lVar20];
        pBVar29 = (BrotliEncoderParams *)((long)pBVar24 - (long)pBVar46);
        if ((((lVar20 == 0) ||
             (local_148 = pBVar55,
             pBVar55[0x8c].dictionary.contextual.context_map[((ulong)pBVar29 & 0xffff) - 0x15] ==
             (uint8_t)uVar26)) && (pBVar46 <= pBVar48)) && (pBVar29 < pBVar24)) {
          puVar30 = (ulong *)(ringbuffer + ((ulong)pBVar29 & ringbuffer_mask));
          puVar38 = puVar19;
          puVar54 = puVar30;
          for (pBVar29 = local_150; (BrotliEncoderParams *)0x7 < pBVar29;
              pBVar29 = (BrotliEncoderParams *)&pBVar29[-1].dictionary.max_quality) {
            uVar21 = *puVar38;
            uVar57 = *puVar54;
            if (uVar21 == uVar57) {
              puVar54 = puVar54 + 1;
            }
            else {
              uVar32 = 0;
              if ((uVar57 ^ uVar21) != 0) {
                for (; ((uVar57 ^ uVar21) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              local_148 = (BrotliEncoderParams *)
                          ((long)puVar54 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar30));
            }
            if (uVar21 != uVar57) goto LAB_00309379;
            puVar38 = puVar38 + 1;
          }
          if (pBVar29 != (BrotliEncoderParams *)0x0) {
            pBVar52 = (BrotliEncoderParams *)0x0;
            do {
              pBVar14 = pBVar52;
              if (*(char *)((long)puVar54 + (long)pBVar52) !=
                  *(char *)((long)puVar38 + (long)pBVar52)) break;
              pBVar52 = (BrotliEncoderParams *)((long)&pBVar52->mode + 1);
              pBVar14 = pBVar29;
            } while (pBVar29 != pBVar52);
            puVar54 = (ulong *)((long)puVar54 + (long)pBVar14);
          }
          local_148 = (BrotliEncoderParams *)((long)puVar54 - (long)puVar30);
LAB_00309379:
          if (((BrotliEncoderParams *)0x1 < local_148) &&
             (pBVar29 = (BrotliEncoderParams *)((long)local_148 * 0x87 + 0x78f), local_160 < pBVar29
             )) {
            if (lVar20 != 0) {
              pBVar29 = (BrotliEncoderParams *)
                        ((long)pBVar29 - (ulong)((0x1ca10U >> ((byte)lVar20 & 0xe) & 0xe) + 0x27));
            }
            if (local_160 < pBVar29) {
              pBVar39 = pBVar29;
              local_120 = local_148;
              pBVar37 = local_148;
              local_160 = pBVar29;
              local_e0 = pBVar46;
            }
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      local_100 = (BrotliEncoderParams *)(ulong)uVar26;
      uVar51 = uVar26 & 0x1ff;
      sVar58 = (hasher->privat)._H42.max_hops;
      uVar57 = (long)pBVar24 -
               (ulong)*(uint *)((long)(pBVar55->dictionary).compound.chunks +
                               (long)local_100 * 4 + -0x68);
      uVar21 = (ulong)*(ushort *)
                       ((long)pBVar55[0x5d].dictionary.contextual.dict + (long)local_100 * 2 + 0xb0)
      ;
      pBVar29 = (BrotliEncoderParams *)0x0;
      local_168 = uVar57;
      do {
        bVar61 = sVar58 == 0;
        sVar58 = sVar58 - 1;
        local_148 = pBVar39;
        if (bVar61) break;
        pBVar29 = (BrotliEncoderParams *)
                  ((long)(pBVar29->dictionary).compound.chunks + (local_168 - 0x68));
        pBVar46 = pBVar37;
        pBVar52 = local_120;
        pBVar14 = local_160;
        pBVar15 = local_e0;
        if (pBVar29 <= pBVar48) {
          uVar56 = (ulong)*(ushort *)((long)pvVar7 + uVar21 * 4 + (ulong)(uVar51 << 0xb) + 2);
          local_168 = (ulong)*(ushort *)((long)pvVar7 + uVar21 * 4 + (ulong)(uVar51 << 0xb));
          uVar32 = (long)(pBVar37->dictionary).compound.chunks + (uVar42 - 0x68);
          uVar21 = uVar56;
          if (uVar32 <= ringbuffer_mask) {
            uVar31 = (long)pBVar24 - (long)pBVar29 & ringbuffer_mask;
            uVar56 = (long)(pBVar37->dictionary).compound.chunks + (uVar31 - 0x68);
            if ((ringbuffer_mask < uVar56) || (ringbuffer[uVar32] != ringbuffer[uVar56]))
            goto LAB_00309565;
            puVar30 = (ulong *)(ringbuffer + uVar31);
            puVar38 = puVar19;
            puVar54 = puVar30;
            for (pBVar52 = local_150; (BrotliEncoderParams *)0x7 < pBVar52;
                pBVar52 = (BrotliEncoderParams *)&pBVar52[-1].dictionary.max_quality) {
              uVar32 = *puVar38;
              uVar56 = *puVar54;
              if (uVar32 == uVar56) {
                puVar54 = puVar54 + 1;
              }
              else {
                uVar31 = 0;
                if ((uVar56 ^ uVar32) != 0) {
                  for (; ((uVar56 ^ uVar32) >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                local_170 = (BrotliEncoderParams *)
                            ((long)puVar54 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar30));
              }
              pBVar46 = local_170;
              if (uVar32 != uVar56) goto LAB_003095aa;
              puVar38 = puVar38 + 1;
            }
            if (pBVar52 != (BrotliEncoderParams *)0x0) {
              pBVar46 = (BrotliEncoderParams *)0x0;
              do {
                pBVar14 = pBVar46;
                if (*(char *)((long)puVar54 + (long)pBVar46) !=
                    *(char *)((long)puVar38 + (long)pBVar46)) break;
                pBVar46 = (BrotliEncoderParams *)((long)&pBVar46->mode + 1);
                pBVar14 = pBVar52;
              } while (pBVar52 != pBVar46);
              puVar54 = (ulong *)((long)puVar54 + (long)pBVar14);
            }
            pBVar46 = (BrotliEncoderParams *)((long)puVar54 - (long)puVar30);
LAB_003095aa:
            if ((BrotliEncoderParams *)0x3 < pBVar46) {
              iVar35 = 0x1f;
              if ((uint)pBVar29 != 0) {
                for (; (uint)pBVar29 >> iVar35 == 0; iVar35 = iVar35 + -1) {
                }
              }
              local_148 = (BrotliEncoderParams *)
                          ((ulong)(iVar35 * -0x1e + 0x780) + (long)pBVar46 * 0x87);
              pBVar52 = pBVar46;
              pBVar14 = local_148;
              pBVar15 = pBVar29;
              if (local_160 < local_148) goto LAB_00309565;
            }
          }
          local_148 = pBVar39;
          pBVar46 = pBVar37;
          pBVar52 = local_120;
          pBVar14 = local_160;
          pBVar15 = local_e0;
        }
LAB_00309565:
        local_e0 = pBVar15;
        local_160 = pBVar14;
        local_120 = pBVar52;
        pBVar39 = local_148;
        pBVar37 = pBVar46;
      } while (pBVar29 <= pBVar48);
      uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar51 * 2);
      *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar51 * 2) = uVar3 + 1;
      uVar16 = uVar3 & 0x1ff;
      pBVar55[0x8c].dictionary.contextual.context_map[((ulong)pBVar24 & 0xffff) - 0x15] =
           (uint8_t)uVar26;
      if (0xfffe < uVar57) {
        uVar57 = 0xffff;
      }
      pBVar39 = (BrotliEncoderParams *)((long)pvVar7 + (ulong)(uVar51 << 0xb));
      *(short *)((long)(pBVar39->dictionary).compound.chunks + (ulong)uVar16 * 4 + -0x68) =
           (short)uVar57;
      *(undefined2 *)((long)(pBVar39->dictionary).compound.chunks + (ulong)uVar16 * 4 + -0x66) =
           *(undefined2 *)
            ((long)pBVar55[0x5d].dictionary.contextual.dict + (long)local_100 * 2 + 0xb0);
      *(int *)((long)(pBVar55->dictionary).compound.chunks + (long)local_100 * 4 + -0x68) =
           (int)pBVar24;
      *(short *)((long)pBVar55[0x5d].dictionary.contextual.dict + (long)local_100 * 2 + 0xb0) =
           (short)uVar16;
      iVar35 = 0;
      pBVar48 = pBVar24;
      local_118 = local_148;
      if ((local_148 == (BrotliEncoderParams *)0x7e4) &&
         (pHVar8 = (hasher->privat)._H42.common,
         pHVar8->dict_num_lookups >> 7 <= pHVar8->dict_num_matches)) {
        uVar21 = (ulong)((uint)((int)*puVar19 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        pBVar48 = (BrotliEncoderParams *)pBVar6->hash_table_lengths;
        iVar35 = 0;
        pBVar55 = (BrotliEncoderParams *)0x0;
        local_148 = (BrotliEncoderParams *)pHVar8->dict_num_lookups;
        do {
          local_148 = (BrotliEncoderParams *)((long)&local_148->mode + 1);
          pHVar8->dict_num_lookups = (size_t)local_148;
          bVar25 = *(byte *)((long)(pBVar48->dictionary).compound.chunks + (uVar21 - 0x68));
          pBVar37 = (BrotliEncoderParams *)(ulong)bVar25;
          if (pBVar37 != (BrotliEncoderParams *)0x0) {
            bVar61 = true;
            local_170 = local_120;
            if (pBVar37 <= local_150) {
              pBVar11 = pBVar6->words;
              puVar54 = (ulong *)(pBVar11->data +
                                 (ulong)pBVar11->offsets_by_length[(long)pBVar37] +
                                 (ulong)pBVar6->hash_table_words[uVar21] * (long)pBVar37);
              puVar38 = puVar19;
              pBVar29 = pBVar37;
              if (7 < bVar25) {
                do {
                  uVar57 = *puVar54;
                  uVar32 = *puVar38;
                  if (uVar57 == uVar32) {
                    puVar38 = puVar38 + 1;
                  }
                  else {
                    uVar56 = 0;
                    if ((uVar32 ^ uVar57) != 0) {
                      for (; ((uVar32 ^ uVar57) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                      }
                    }
                    pBVar39 = (BrotliEncoderParams *)
                              ((long)puVar38 + ((uVar56 >> 3 & 0x1fffffff) - (long)puVar19));
                  }
                  if (uVar57 != uVar32) goto LAB_0030a832;
                  puVar54 = puVar54 + 1;
                  pBVar29 = (BrotliEncoderParams *)&pBVar29[-1].dictionary.max_quality;
                } while ((int *)0x7 < pBVar29);
              }
              puVar30 = puVar38;
              if (pBVar29 != (BrotliEncoderParams *)0x0) {
                puVar30 = (ulong *)((long)puVar38 + (long)pBVar29);
                pBVar39 = (BrotliEncoderParams *)0x0;
                do {
                  if (*(char *)((long)puVar38 + (long)pBVar39) !=
                      *(char *)((long)puVar54 + (long)pBVar39)) {
                    puVar30 = (ulong *)((long)puVar38 + (long)pBVar39);
                    break;
                  }
                  pBVar39 = (BrotliEncoderParams *)((long)&pBVar39->mode + 1);
                } while (pBVar29 != pBVar39);
              }
              pBVar39 = (BrotliEncoderParams *)((long)puVar30 - (long)puVar19);
LAB_0030a832:
              local_170 = local_120;
              if (((pBVar39 != (BrotliEncoderParams *)0x0) &&
                  (pBVar37 < (BrotliEncoderParams *)
                             ((long)(pBVar39->dictionary).compound.chunks +
                             ((ulong)pBVar6->cutoffTransformsCount - 0x68)))) &&
                 (pBVar37 = (BrotliEncoderParams *)
                            ((long)(pBVar28->dictionary).compound.chunks +
                            ((ulong)((uint)(pBVar6->cutoffTransforms >>
                                           ((char)((long)pBVar37 - (long)pBVar39) * '\x06' & 0x3fU))
                                    & 0x3f) + ((long)pBVar37 - (long)pBVar39) * 4 <<
                            (*(byte *)((long)(pBVar37->dictionary).compound.chunks +
                                      (long)(pBVar11[-1].offsets_by_length + 10)) & 0x3f)) +
                            (ulong)pBVar6->hash_table_words[uVar21] + lVar1 + -0x68),
                 pBVar37 <= pBVar22)) {
                iVar62 = 0x1f;
                if ((uint)pBVar37 != 0) {
                  for (; (uint)pBVar37 >> iVar62 == 0; iVar62 = iVar62 + -1) {
                  }
                }
                pBVar29 = (BrotliEncoderParams *)
                          (((long)pBVar39 * 0x87 - (ulong)(uint)(iVar62 * 0x1e)) + 0x780);
                local_170 = local_120;
                if (local_118 <= pBVar29) {
                  iVar35 = (uint)bVar25 - (int)pBVar39;
                  bVar61 = false;
                  local_170 = pBVar39;
                  local_118 = pBVar29;
                  local_e0 = pBVar37;
                }
              }
            }
            local_120 = local_170;
            if (!bVar61) {
              pHVar8->dict_num_matches = pHVar8->dict_num_matches + 1;
            }
          }
          local_100 = (BrotliEncoderParams *)((long)&pBVar55->mode + 1);
          uVar21 = uVar21 + 1;
          bVar61 = pBVar55 == (BrotliEncoderParams *)0x0;
          pBVar55 = local_100;
        } while (bVar61);
      }
      pBVar22 = (BrotliEncoderParams *)(params->dictionary).compound.num_chunks;
      if (pBVar22 != (BrotliEncoderParams *)0x0) {
        local_100 = (BrotliEncoderParams *)0x0;
        do {
          pPVar9 = (params->dictionary).compound.chunks[(long)local_100];
          bVar25 = (byte)pPVar9->bucket_bits;
          bVar45 = (byte)pPVar9->slot_bits;
          bVar13 = -(char)pPVar9->hash_bits;
          uVar21 = ((*puVar19 << (bVar13 & 0x3f)) >> (bVar13 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar25 & 0x3f);
          lVar20 = (1L << (bVar45 & 0x3f)) * 4;
          lVar47 = (1L << (bVar25 & 0x3f)) * 2;
          bVar45 = -bVar45;
          pBVar48 = (BrotliEncoderParams *)
                    ((long)&pPVar9[1].magic + (ulong)pPVar9->num_items * 4 + lVar47 + lVar20);
          if (pPVar9->magic != 0xdebcede0) {
            pBVar48 = *(BrotliEncoderParams **)pBVar48;
          }
          pBVar55 = (BrotliEncoderParams *)
                    ((long)pBVar28 +
                    ((params->dictionary).compound.total_size -
                    (params->dictionary).compound.chunk_offsets[(long)local_100]));
          uVar57 = (ulong)pPVar9->source_size;
          uVar3 = *(ushort *)((long)&pPVar9[1].magic + (uVar21 & 0xffffffff) * 2 + lVar20);
          puVar43 = (uint *)((long)&pPVar9[1].magic +
                            (ulong)((uint)uVar3 +
                                   (&pPVar9[1].magic)
                                   [(uint)((int)uVar21 << (bVar45 & 0x1f)) >> (bVar45 & 0x1f)]) * 4
                            + lVar47 + lVar20);
          lVar20 = 0;
          local_170 = local_120;
          do {
            local_148 = (BrotliEncoderParams *)(long)dist_cache[lVar20];
            if (((BrotliEncoderParams *)((long)pBVar55 - uVar57) < local_148) &&
               (local_148 <= pBVar55)) {
              pBVar39 = (BrotliEncoderParams *)(uVar57 - ((long)pBVar55 - (long)local_148));
              if (local_150 <= pBVar39) {
                pBVar39 = local_150;
              }
              puVar30 = (ulong *)(((long)pBVar55 - (long)local_148) + (long)pBVar48);
              puVar38 = puVar19;
              puVar54 = puVar30;
              pBVar37 = (BrotliEncoderParams *)commands;
              for (; (BrotliEncoderParams *)0x7 < pBVar39;
                  pBVar39 = (BrotliEncoderParams *)&pBVar39[-1].dictionary.max_quality) {
                uVar21 = *puVar38;
                uVar32 = *puVar54;
                if (uVar21 == uVar32) {
                  puVar54 = puVar54 + 1;
                }
                else {
                  uVar56 = 0;
                  if ((uVar32 ^ uVar21) != 0) {
                    for (; ((uVar32 ^ uVar21) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                    }
                  }
                  pBVar37 = (BrotliEncoderParams *)
                            ((long)puVar54 + ((uVar56 >> 3 & 0x1fffffff) - (long)puVar30));
                }
                if (uVar21 != uVar32) goto LAB_00309844;
                puVar38 = puVar38 + 1;
              }
              puVar53 = puVar54;
              if (pBVar39 != (BrotliEncoderParams *)0x0) {
                puVar53 = (ulong *)((long)puVar54 + (long)pBVar39);
                pBVar37 = (BrotliEncoderParams *)0x0;
                do {
                  if (*(char *)((long)puVar54 + (long)pBVar37) !=
                      *(char *)((long)puVar38 + (long)pBVar37)) {
                    puVar53 = (ulong *)((long)puVar54 + (long)pBVar37);
                    break;
                  }
                  pBVar37 = (BrotliEncoderParams *)((long)&pBVar37->mode + 1);
                } while (pBVar39 != pBVar37);
              }
              pBVar37 = (BrotliEncoderParams *)((long)puVar53 - (long)puVar30);
LAB_00309844:
              if (((BrotliEncoderParams *)0x1 < pBVar37) &&
                 (pBVar39 = (BrotliEncoderParams *)((long)pBVar37 * 0x87 + 0x78f),
                 local_118 < pBVar39)) {
                if (lVar20 != 0) {
                  pBVar39 = (BrotliEncoderParams *)
                            ((long)pBVar39 - (ulong)((0x1ca10U >> ((byte)lVar20 & 2) & 4) + 0x27));
                }
                if (local_118 < pBVar39) {
                  if (local_170 < pBVar37) {
                    local_170 = pBVar37;
                  }
                  iVar35 = 0;
                  local_120 = pBVar37;
                  local_118 = pBVar39;
                  local_e0 = local_148;
                }
              }
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != 4);
          pBVar39 = (BrotliEncoderParams *)0x4;
          if (uVar3 != 0xffff) {
            do {
              uVar26 = *puVar43;
              local_148 = (BrotliEncoderParams *)(ulong)(uVar26 & 0x7fffffff);
              pBVar29 = (BrotliEncoderParams *)((long)pBVar55 - (long)local_148);
              pBVar37 = (BrotliEncoderParams *)(uVar57 - (long)local_148);
              if (local_150 <= (BrotliEncoderParams *)(uVar57 - (long)local_148)) {
                pBVar37 = local_150;
              }
              if ((((pBVar29 <= (BrotliEncoderParams *)(params->dist).max_distance) &&
                   (uVar21 = (long)(local_170->dictionary).compound.chunks + (uVar42 - 0x68),
                   uVar21 <= ringbuffer_mask)) && (local_170 < pBVar37)) &&
                 (ringbuffer[uVar21] ==
                  (local_170->dictionary).contextual.context_map
                  [(long)(pBVar48[-1].dictionary.contextual.context_map +
                         (long)((long)(local_148->dictionary).compound.chunks + 0x26))])) {
                local_148 = (BrotliEncoderParams *)
                            ((long)(pBVar48->dictionary).contextual.dict +
                            (long)(local_148[-1].dictionary.contextual.dict + 1));
                puVar38 = puVar19;
                pBVar46 = local_148;
                for (; (BrotliEncoderParams *)0x7 < pBVar37;
                    pBVar37 = (BrotliEncoderParams *)&pBVar37[-1].dictionary.max_quality) {
                  uVar21 = *puVar38;
                  uVar32._0_4_ = pBVar46->mode;
                  uVar32._4_4_ = pBVar46->quality;
                  if (uVar21 == uVar32) {
                    pBVar46 = (BrotliEncoderParams *)&pBVar46->lgwin;
                  }
                  else {
                    uVar56 = 0;
                    if ((uVar32 ^ uVar21) != 0) {
                      for (; ((uVar32 ^ uVar21) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                      }
                    }
                    pBVar39 = (BrotliEncoderParams *)
                              ((long)pBVar46 + ((uVar56 >> 3 & 0x1fffffff) - (long)local_148));
                  }
                  if (uVar21 != uVar32) goto LAB_003099dc;
                  puVar38 = puVar38 + 1;
                }
                if (pBVar37 != (BrotliEncoderParams *)0x0) {
                  pBVar39 = (BrotliEncoderParams *)0x0;
                  do {
                    pBVar52 = pBVar39;
                    if (*(char *)((long)(pBVar39->dictionary).contextual.dict +
                                 (long)(pBVar46[-1].dictionary.contextual.dict + 1)) !=
                        *(char *)((long)puVar38 + (long)pBVar39)) break;
                    pBVar39 = (BrotliEncoderParams *)((long)&pBVar39->mode + 1);
                    pBVar52 = pBVar37;
                  } while (pBVar37 != pBVar39);
                  pBVar46 = (BrotliEncoderParams *)
                            ((long)(pBVar52->dictionary).contextual.dict +
                            (long)(pBVar46[-1].dictionary.contextual.dict + 1));
                }
                pBVar39 = (BrotliEncoderParams *)((long)pBVar46 - (long)local_148);
LAB_003099dc:
                if ((BrotliEncoderParams *)0x3 < pBVar39) {
                  iVar62 = 0x1f;
                  if ((uint)pBVar29 != 0) {
                    for (; (uint)pBVar29 >> iVar62 == 0; iVar62 = iVar62 + -1) {
                    }
                  }
                  pBVar37 = (BrotliEncoderParams *)
                            ((ulong)(iVar62 * -0x1e + 0x780) + (long)pBVar39 * 0x87);
                  if (local_118 < pBVar37) {
                    iVar35 = 0;
                    local_170 = pBVar39;
                    local_120 = pBVar39;
                    local_118 = pBVar37;
                    local_e0 = pBVar29;
                  }
                }
              }
              puVar43 = puVar43 + 1;
            } while (-1 < (int)uVar26);
          }
          local_100 = (BrotliEncoderParams *)((long)&local_100->mode + 1);
        } while (local_100 != pBVar22);
      }
      if (local_118 < (BrotliEncoderParams *)0x7e5) {
        local_130 = local_130 + 1;
        position = (long)&pBVar24->mode + 1;
        if (pBVar59 < position) {
          if ((BrotliEncoderParams *)
              ((long)(pBVar59->dictionary).compound.chunks + ((ulong)(uint)((int)lVar49 * 4) - 0x68)
              ) < position) {
            pBVar24 = (BrotliEncoderParams *)((long)&pBVar24->stream_offset + 1);
            if ((BrotliEncoderParams *)(puVar2 + -4) <= pBVar24) {
              pBVar24 = (BrotliEncoderParams *)(puVar2 + -4);
            }
            if (position < pBVar24) {
              pvVar7 = (hasher->privat)._H42.extra[0];
              pvVar10 = (hasher->privat)._H42.extra[1];
              do {
                uVar26 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         0x11;
                uVar42 = (ulong)uVar26;
                uVar16 = uVar26 & 0x1ff;
                uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2);
                *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2) = uVar3 + 1;
                uVar51 = uVar3 & 0x1ff;
                uVar21 = position - *(uint *)((long)pvVar7 + uVar42 * 4);
                if (0xfffe < uVar21) {
                  uVar21 = 0xffff;
                }
                *(char *)((long)pvVar7 + (position & 0xffff) + 0x30000) = (char)uVar26;
                local_148 = (BrotliEncoderParams *)(ulong)uVar51;
                *(short *)((long)pvVar10 + (long)local_148 * 4 + (ulong)(uVar16 << 0xb)) =
                     (short)uVar21;
                *(undefined2 *)((long)pvVar10 + (long)local_148 * 4 + (ulong)(uVar16 << 0xb) + 2) =
                     *(undefined2 *)((long)pvVar7 + uVar42 * 2 + 0x20000);
                *(int *)((long)pvVar7 + uVar42 * 4) = (int)position;
                *(short *)((long)pvVar7 + uVar42 * 2 + 0x20000) = (short)uVar51;
                local_130 = local_130 + 4;
                position = (size_t)&((BrotliEncoderParams *)position)->quality;
              } while (position < pBVar24);
            }
          }
          else {
            pBVar24 = (BrotliEncoderParams *)((long)&pBVar24->lgwin + 1);
            if ((BrotliEncoderParams *)(puVar2 + -3) <= pBVar24) {
              pBVar24 = (BrotliEncoderParams *)(puVar2 + -3);
            }
            if (position < pBVar24) {
              pvVar7 = (hasher->privat)._H42.extra[0];
              pvVar10 = (hasher->privat)._H42.extra[1];
              do {
                uVar26 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         0x11;
                uVar42 = (ulong)uVar26;
                uVar16 = uVar26 & 0x1ff;
                uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2);
                *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2) = uVar3 + 1;
                uVar51 = uVar3 & 0x1ff;
                uVar21 = position - *(uint *)((long)pvVar7 + uVar42 * 4);
                if (0xfffe < uVar21) {
                  uVar21 = 0xffff;
                }
                *(char *)((long)pvVar7 + (position & 0xffff) + 0x30000) = (char)uVar26;
                local_148 = (BrotliEncoderParams *)(ulong)uVar51;
                *(short *)((long)pvVar10 + (long)local_148 * 4 + (ulong)(uVar16 << 0xb)) =
                     (short)uVar21;
                *(undefined2 *)((long)pvVar10 + (long)local_148 * 4 + (ulong)(uVar16 << 0xb) + 2) =
                     *(undefined2 *)((long)pvVar7 + uVar42 * 2 + 0x20000);
                *(int *)((long)pvVar7 + uVar42 * 4) = (int)position;
                *(short *)((long)pvVar7 + uVar42 * 2 + 0x20000) = (short)uVar51;
                local_130 = local_130 + 2;
                position = (long)&((BrotliEncoderParams *)position)->mode + 2;
              } while (position < pBVar24);
            }
          }
        }
      }
      else {
        iVar62 = 0;
        do {
          local_150 = (BrotliEncoderParams *)&local_150[-1].dictionary.field_0x527;
          pBVar59 = (BrotliEncoderParams *)&local_120[-1].dictionary.field_0x527;
          if (local_150 <= pBVar59) {
            pBVar59 = local_150;
          }
          if (4 < params->quality) {
            pBVar59 = (BrotliEncoderParams *)0x0;
          }
          pBVar28 = (BrotliEncoderParams *)((long)&pBVar24->mode + 1);
          pBVar22 = pBVar36;
          if (pBVar28 < pBVar36) {
            pBVar22 = pBVar28;
          }
          pBVar55 = (BrotliEncoderParams *)
                    ((long)(pBVar24->dictionary).compound.chunks + (sVar4 - 0x67));
          if (pBVar36 <= pBVar55) {
            pBVar55 = pBVar36;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_9c = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_b0 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)pBVar24 & ringbuffer_mask]]];
            local_b0 = (ulong)ringbuffer[(ulong)pBVar24 & ringbuffer_mask];
          }
          pBVar6 = (params->dictionary).contextual.dict[local_9c];
          pBVar39 = (BrotliEncoderParams *)(params->dist).max_distance;
          pvVar7 = (hasher->privat)._H42.extra[0];
          pvVar10 = (hasher->privat)._H42.extra[1];
          uVar42 = (ulong)pBVar28 & ringbuffer_mask;
          puVar19 = (ulong *)(ringbuffer + uVar42);
          uVar26 = (uint)(*(int *)(ringbuffer + uVar42) * 0x1e35a7bd) >> 0x11;
          local_170 = (BrotliEncoderParams *)0x7e4;
          lVar20 = 0;
          local_160 = (BrotliEncoderParams *)0x0;
          local_140 = (BrotliEncoderParams *)0x0;
          pBVar37 = (BrotliEncoderParams *)0x7e4;
          do {
            pBVar46 = (BrotliEncoderParams *)(long)dist_cache[lVar20];
            pBVar29 = (BrotliEncoderParams *)((long)pBVar28 - (long)pBVar46);
            if (((lVar20 == 0) ||
                (pBVar48 = (BrotliEncoderParams *)(ulong)uVar26,
                *(char *)((long)pvVar7 + ((ulong)pBVar29 & 0xffff) + 0x30000) == (char)uVar26)) &&
               ((pBVar46 <= pBVar22 && (pBVar29 < pBVar28)))) {
              pBVar29 = (BrotliEncoderParams *)(ringbuffer + ((ulong)pBVar29 & ringbuffer_mask));
              puVar38 = puVar19;
              local_100 = pBVar29;
              for (puVar23 = (undefined1 *)local_150; (undefined1 *)0x7 < puVar23;
                  puVar23 = puVar23 + -8) {
                uVar21 = *puVar38;
                uVar57._0_4_ = local_100->mode;
                uVar57._4_4_ = local_100->quality;
                if (uVar21 == uVar57) {
                  local_100 = (BrotliEncoderParams *)&local_100->lgwin;
                }
                else {
                  uVar32 = 0;
                  if ((uVar57 ^ uVar21) != 0) {
                    for (; ((uVar57 ^ uVar21) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  pBVar48 = (BrotliEncoderParams *)
                            ((long)local_100 + ((uVar32 >> 3 & 0x1fffffff) - (long)pBVar29));
                }
                if (uVar21 != uVar57) goto LAB_00309ca1;
                puVar38 = puVar38 + 1;
              }
              pBVar48 = local_100;
              if (puVar23 != (undefined1 *)0x0) {
                pBVar48 = (BrotliEncoderParams *)
                          (puVar23 + (long)(&local_100->dictionary + -1) + 0x4d8);
                lVar47 = 0;
                do {
                  if (*(char *)((long)(local_100->dictionary).compound.chunks + lVar47 + -0x68) !=
                      *(char *)((long)puVar38 + lVar47)) {
                    pBVar48 = (BrotliEncoderParams *)
                              ((long)(local_100->dictionary).compound.chunks + lVar47 + -0x68);
                    break;
                  }
                  lVar47 = lVar47 + 1;
                } while (puVar23 != (undefined1 *)lVar47);
              }
              local_100 = (BrotliEncoderParams *)((long)pBVar48 - (long)pBVar29);
              pBVar48 = local_100;
LAB_00309ca1:
              if (((BrotliEncoderParams *)0x1 < pBVar48) &&
                 (pBVar29 = (BrotliEncoderParams *)((long)pBVar48 * 0x87 + 0x78f),
                 local_170 < pBVar29)) {
                if (lVar20 != 0) {
                  pBVar29 = (BrotliEncoderParams *)
                            ((long)pBVar29 -
                            (ulong)((0x1ca10U >> ((byte)lVar20 & 0xe) & 0xe) + 0x27));
                }
                if (local_170 < pBVar29) {
                  pBVar37 = pBVar29;
                  pBVar59 = pBVar48;
                  local_170 = pBVar29;
                  local_160 = pBVar48;
                  local_140 = pBVar46;
                }
              }
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x10);
          uVar32 = (ulong)uVar26;
          uVar51 = uVar26 & 0x1ff;
          sVar58 = (hasher->privat)._H42.max_hops;
          uVar56 = (long)pBVar28 - (ulong)*(uint *)((long)pvVar7 + uVar32 * 4);
          uVar57 = (ulong)*(ushort *)((long)pvVar7 + uVar32 * 2 + 0x20000);
          pBVar29 = (BrotliEncoderParams *)0x0;
          pBVar48 = local_100;
          uVar21 = uVar56;
          do {
            bVar61 = sVar58 == 0;
            sVar58 = sVar58 - 1;
            local_100 = pBVar37;
            local_148 = local_160;
            if (bVar61) break;
            pBVar29 = (BrotliEncoderParams *)
                      ((long)(pBVar29->dictionary).compound.chunks + (uVar21 - 0x68));
            pBVar46 = local_160;
            pBVar52 = pBVar59;
            pBVar14 = local_170;
            pBVar15 = local_140;
            if (pBVar29 <= pBVar22) {
              uVar44 = (ulong)*(ushort *)((long)pvVar10 + uVar57 * 4 + (ulong)(uVar51 << 0xb) + 2);
              uVar21 = (ulong)*(ushort *)((long)pvVar10 + uVar57 * 4 + (ulong)(uVar51 << 0xb));
              uVar31 = (long)(pBVar59->dictionary).compound.chunks + (uVar42 - 0x68);
              uVar57 = uVar44;
              if (uVar31 <= ringbuffer_mask) {
                uVar33 = (long)pBVar28 - (long)pBVar29 & ringbuffer_mask;
                uVar44 = (long)(pBVar59->dictionary).compound.chunks + (uVar33 - 0x68);
                if ((uVar44 <= ringbuffer_mask) && (ringbuffer[uVar31] == ringbuffer[uVar44])) {
                  puVar30 = (ulong *)(ringbuffer + uVar33);
                  puVar38 = puVar19;
                  puVar54 = puVar30;
                  for (puVar23 = (undefined1 *)local_150; (undefined1 *)0x7 < puVar23;
                      puVar23 = puVar23 + -8) {
                    uVar31 = *puVar38;
                    uVar44 = *puVar54;
                    if (uVar31 == uVar44) {
                      puVar54 = puVar54 + 1;
                    }
                    else {
                      uVar33 = 0;
                      if ((uVar44 ^ uVar31) != 0) {
                        for (; ((uVar44 ^ uVar31) >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                        }
                      }
                      pBVar48 = (BrotliEncoderParams *)
                                ((long)puVar54 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar30));
                    }
                    if (uVar31 != uVar44) goto LAB_00309e6b;
                    puVar38 = puVar38 + 1;
                  }
                  puVar53 = puVar54;
                  if (puVar23 != (undefined1 *)0x0) {
                    puVar53 = (ulong *)((long)puVar54 + (long)puVar23);
                    lVar20 = 0;
                    do {
                      if (*(char *)((long)puVar54 + lVar20) != *(char *)((long)puVar38 + lVar20)) {
                        puVar53 = (ulong *)((long)puVar54 + lVar20);
                        break;
                      }
                      lVar20 = lVar20 + 1;
                    } while (puVar23 != (undefined1 *)lVar20);
                  }
                  pBVar48 = (BrotliEncoderParams *)((long)puVar53 - (long)puVar30);
LAB_00309e6b:
                  if ((BrotliEncoderParams *)0x3 < pBVar48) {
                    iVar41 = 0x1f;
                    if ((uint)pBVar29 != 0) {
                      for (; (uint)pBVar29 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                      }
                    }
                    local_100 = (BrotliEncoderParams *)
                                ((ulong)(iVar41 * -0x1e + 0x780) + (long)pBVar48 * 0x87);
                    pBVar46 = pBVar48;
                    pBVar52 = pBVar48;
                    pBVar14 = local_100;
                    pBVar15 = pBVar29;
                    if (local_170 < local_100) goto LAB_00309ead;
                  }
                }
              }
              local_100 = pBVar37;
              pBVar46 = local_160;
              pBVar52 = pBVar59;
              pBVar14 = local_170;
              pBVar15 = local_140;
            }
LAB_00309ead:
            local_140 = pBVar15;
            local_170 = pBVar14;
            local_160 = pBVar46;
            pBVar48 = local_100;
            local_148 = local_160;
            pBVar37 = local_100;
            pBVar59 = pBVar52;
          } while (pBVar29 <= pBVar22);
          uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar51 * 2);
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar51 * 2) = uVar3 + 1;
          uVar16 = uVar3 & 0x1ff;
          *(char *)((long)pvVar7 + ((ulong)pBVar28 & 0xffff) + 0x30000) = (char)uVar26;
          if (0xfffe < uVar56) {
            uVar56 = 0xffff;
          }
          *(short *)((long)pvVar10 + (ulong)uVar16 * 4 + (ulong)(uVar51 << 0xb)) = (short)uVar56;
          *(undefined2 *)((long)pvVar10 + (ulong)uVar16 * 4 + (ulong)(uVar51 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar7 + uVar32 * 2 + 0x20000);
          *(int *)((long)pvVar7 + uVar32 * 4) = (int)pBVar28;
          *(short *)((long)pvVar7 + uVar32 * 2 + 0x20000) = (short)uVar16;
          pBVar48 = pBVar28;
          if (local_100 == (BrotliEncoderParams *)0x7e4) {
            pHVar8 = (hasher->privat)._H42.common;
            if (pHVar8->dict_num_matches < pHVar8->dict_num_lookups >> 7) {
              iVar41 = 0;
            }
            else {
              pBVar48 = (BrotliEncoderParams *)
                        (ulong)((uint)((int)*puVar19 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              local_170 = (BrotliEncoderParams *)pBVar6->hash_table_lengths;
              sVar58 = pHVar8->dict_num_lookups;
              iVar41 = 0;
              lVar20 = 0;
              do {
                sVar58 = sVar58 + 1;
                pHVar8->dict_num_lookups = sVar58;
                bVar25 = *(byte *)((long)(pBVar48->dictionary).contextual.dict +
                                  (long)(local_170[-1].dictionary.contextual.dict + 1));
                puVar23 = (undefined1 *)(ulong)bVar25;
                if (puVar23 != (undefined1 *)0x0) {
                  bVar61 = true;
                  if (puVar23 <= local_150) {
                    pBVar11 = pBVar6->words;
                    puVar54 = (ulong *)(pBVar11->data +
                                       (ulong)pBVar11->offsets_by_length[(long)puVar23] +
                                       (ulong)pBVar6->hash_table_words[(long)pBVar48] *
                                       (long)puVar23);
                    puVar38 = puVar19;
                    puVar50 = puVar23;
                    pBVar59 = params;
                    if (7 < bVar25) {
                      do {
                        uVar21 = *puVar54;
                        uVar57 = *puVar38;
                        if (uVar21 == uVar57) {
                          puVar38 = puVar38 + 1;
                        }
                        else {
                          uVar32 = 0;
                          if ((uVar57 ^ uVar21) != 0) {
                            for (; ((uVar57 ^ uVar21) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                            }
                          }
                          pBVar59 = (BrotliEncoderParams *)
                                    ((long)puVar38 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar19));
                        }
                        if (uVar21 != uVar57) goto LAB_0030a4a2;
                        puVar54 = puVar54 + 1;
                        puVar50 = puVar50 + -8;
                      } while ((undefined1 *)0x7 < puVar50);
                    }
                    puVar30 = puVar38;
                    if (puVar50 != (undefined1 *)0x0) {
                      puVar30 = (ulong *)((long)puVar38 + (long)puVar50);
                      lVar47 = 0;
                      do {
                        if (*(char *)((long)puVar38 + lVar47) != *(char *)((long)puVar54 + lVar47))
                        {
                          puVar30 = (ulong *)((long)puVar38 + lVar47);
                          break;
                        }
                        lVar47 = lVar47 + 1;
                      } while (puVar50 != (undefined1 *)lVar47);
                    }
                    pBVar59 = (BrotliEncoderParams *)((long)puVar30 - (long)puVar19);
LAB_0030a4a2:
                    if (((pBVar59 != (BrotliEncoderParams *)0x0) &&
                        (puVar23 < (undefined1 *)
                                   ((long)(pBVar59->dictionary).compound.chunks +
                                   ((ulong)pBVar6->cutoffTransformsCount - 0x68)))) &&
                       (pBVar22 = (BrotliEncoderParams *)
                                  ((long)(pBVar55->dictionary).compound.chunks +
                                  ((ulong)((uint)(pBVar6->cutoffTransforms >>
                                                 ((char)((long)puVar23 - (long)pBVar59) * '\x06' &
                                                 0x3fU)) & 0x3f) +
                                   ((long)puVar23 - (long)pBVar59) * 4 <<
                                  (puVar23[(long)pBVar11] & 0x3f)) +
                                  (ulong)pBVar6->hash_table_words[(long)pBVar48] + lVar1 + -0x68),
                       pBVar22 <= pBVar39)) {
                      iVar27 = 0x1f;
                      if ((uint)pBVar22 != 0) {
                        for (; (uint)pBVar22 >> iVar27 == 0; iVar27 = iVar27 + -1) {
                        }
                      }
                      pBVar37 = (BrotliEncoderParams *)
                                (((long)pBVar59 * 0x87 - (ulong)(uint)(iVar27 * 0x1e)) + 0x780);
                      if (local_100 <= pBVar37) {
                        iVar41 = (uint)bVar25 - (int)pBVar59;
                        bVar61 = false;
                        local_100 = pBVar37;
                        local_148 = pBVar59;
                        local_140 = pBVar22;
                      }
                    }
                  }
                  if (!bVar61) {
                    pHVar8->dict_num_matches = pHVar8->dict_num_matches + 1;
                  }
                }
                pBVar48 = (BrotliEncoderParams *)((long)&pBVar48->mode + 1);
                bVar61 = lVar20 == 0;
                lVar20 = lVar20 + 1;
              } while (bVar61);
            }
          }
          else {
            iVar41 = 0;
          }
          sVar58 = (params->dictionary).compound.num_chunks;
          if (sVar58 != 0) {
            local_170 = (BrotliEncoderParams *)(params->dist).max_distance;
            sVar60 = 0;
            do {
              pPVar9 = (params->dictionary).compound.chunks[sVar60];
              bVar25 = (byte)pPVar9->bucket_bits;
              bVar45 = (byte)pPVar9->slot_bits;
              lVar20 = 1L << (bVar25 & 0x3f);
              bVar13 = -(char)pPVar9->hash_bits;
              uVar21 = ((*puVar19 << (bVar13 & 0x3f)) >> (bVar13 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar25 & 0x3f);
              pBVar59 = (BrotliEncoderParams *)(&pPVar9[1].magic + (1L << (bVar45 & 0x3f)));
              bVar45 = -bVar45;
              pBVar22 = (BrotliEncoderParams *)
                        (ulong)((uint)((int)uVar21 << (bVar45 & 0x1f)) >> (bVar45 & 0x1f));
              puVar34 = (undefined8 *)
                        ((long)(pBVar59->dictionary).compound.chunks +
                        (ulong)pPVar9->num_items * 4 + lVar20 * 2 + -0x68);
              if (pPVar9->magic != 0xdebcede0) {
                puVar34 = (undefined8 *)*puVar34;
              }
              pBVar37 = (BrotliEncoderParams *)
                        ((long)pBVar55 +
                        ((params->dictionary).compound.total_size -
                        (params->dictionary).compound.chunk_offsets[sVar60]));
              uVar57 = (ulong)pPVar9->source_size;
              uVar3 = *(ushort *)
                       ((long)(pBVar59->dictionary).compound.chunks +
                       (uVar21 & 0xffffffff) * 2 + -0x68);
              puVar43 = (uint *)((long)(pBVar59->dictionary).compound.chunks +
                                (ulong)((uint)uVar3 +
                                       (&pPVar9->source_size)[(long)&pBVar22->quality]) * 4 +
                                lVar20 * 2 + -0x68);
              lVar20 = 0;
              pBVar39 = local_148;
              do {
                pBVar48 = (BrotliEncoderParams *)(long)dist_cache[lVar20];
                if (((BrotliEncoderParams *)((long)pBVar37 - uVar57) < pBVar48) &&
                   (pBVar48 <= pBVar37)) {
                  pBVar59 = (BrotliEncoderParams *)(uVar57 - ((long)pBVar37 - (long)pBVar48));
                  if (local_150 <= pBVar59) {
                    pBVar59 = local_150;
                  }
                  puVar30 = (ulong *)(((long)pBVar37 - (long)pBVar48) + (long)puVar34);
                  puVar38 = puVar19;
                  puVar54 = puVar30;
                  for (; (BrotliEncoderParams *)0x7 < pBVar59;
                      pBVar59 = (BrotliEncoderParams *)&pBVar59[-1].dictionary.max_quality) {
                    uVar21 = *puVar38;
                    uVar32 = *puVar54;
                    if (uVar21 == uVar32) {
                      puVar54 = puVar54 + 1;
                    }
                    else {
                      uVar56 = 0;
                      if ((uVar32 ^ uVar21) != 0) {
                        for (; ((uVar32 ^ uVar21) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                        }
                      }
                      pBVar22 = (BrotliEncoderParams *)
                                ((long)puVar54 + ((uVar56 >> 3 & 0x1fffffff) - (long)puVar30));
                    }
                    if (uVar21 != uVar32) goto LAB_0030a152;
                    puVar38 = puVar38 + 1;
                  }
                  puVar53 = puVar54;
                  if (pBVar59 != (BrotliEncoderParams *)0x0) {
                    puVar53 = (ulong *)((long)puVar54 + (long)pBVar59);
                    pBVar22 = (BrotliEncoderParams *)0x0;
                    do {
                      if (*(char *)((long)puVar54 + (long)pBVar22) !=
                          *(char *)((long)puVar38 + (long)pBVar22)) {
                        puVar53 = (ulong *)((long)puVar54 + (long)pBVar22);
                        break;
                      }
                      pBVar22 = (BrotliEncoderParams *)((long)&pBVar22->mode + 1);
                    } while (pBVar59 != pBVar22);
                  }
                  pBVar22 = (BrotliEncoderParams *)((long)puVar53 - (long)puVar30);
LAB_0030a152:
                  if (((BrotliEncoderParams *)0x1 < pBVar22) &&
                     (pBVar29 = (BrotliEncoderParams *)((long)pBVar22 * 0x87 + 0x78f),
                     local_100 < pBVar29)) {
                    if (lVar20 != 0) {
                      pBVar29 = (BrotliEncoderParams *)
                                ((long)pBVar29 -
                                (ulong)((0x1ca10U >> ((byte)lVar20 & 2) & 4) + 0x27));
                    }
                    if (local_100 < pBVar29) {
                      if (pBVar39 < pBVar22) {
                        pBVar39 = pBVar22;
                      }
                      iVar41 = 0;
                      local_148 = pBVar22;
                      local_140 = pBVar48;
                      local_100 = pBVar29;
                    }
                  }
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 != 4);
              if (uVar3 != 0xffff) {
                do {
                  uVar26 = *puVar43;
                  pBVar48 = (BrotliEncoderParams *)(ulong)(uVar26 & 0x7fffffff);
                  pBVar29 = (BrotliEncoderParams *)((long)pBVar37 - (long)pBVar48);
                  pBVar22 = (BrotliEncoderParams *)(uVar57 - (long)pBVar48);
                  if (local_150 <= (BrotliEncoderParams *)(uVar57 - (long)pBVar48)) {
                    pBVar22 = local_150;
                  }
                  if ((((pBVar29 <= local_170) &&
                       (uVar21 = (long)(pBVar39->dictionary).compound.chunks + (uVar42 - 0x68),
                       uVar21 <= ringbuffer_mask)) && (pBVar39 < pBVar22)) &&
                     (ringbuffer[uVar21] ==
                      *(uint8_t *)
                       ((long)puVar34 +
                       (long)(pBVar48->dictionary).contextual.dict +
                       (long)(pBVar39[-1].dictionary.contextual.dict + 1)))) {
                    pBVar48 = (BrotliEncoderParams *)
                              ((long)puVar34 + (long)(&pBVar48->dictionary + -1) + 0x4d8);
                    puVar38 = puVar19;
                    pBVar46 = pBVar48;
                    for (; (BrotliEncoderParams *)0x7 < pBVar22;
                        pBVar22 = (BrotliEncoderParams *)&pBVar22[-1].dictionary.max_quality) {
                      uVar21 = *puVar38;
                      uVar56._0_4_ = pBVar46->mode;
                      uVar56._4_4_ = pBVar46->quality;
                      if (uVar21 == uVar56) {
                        pBVar46 = (BrotliEncoderParams *)&pBVar46->lgwin;
                      }
                      else {
                        uVar32 = 0;
                        if ((uVar56 ^ uVar21) != 0) {
                          for (; ((uVar56 ^ uVar21) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                          }
                        }
                        pBVar59 = (BrotliEncoderParams *)
                                  ((long)pBVar46 + ((uVar32 >> 3 & 0x1fffffff) - (long)pBVar48));
                      }
                      if (uVar21 != uVar56) goto LAB_0030a2af;
                      puVar38 = puVar38 + 1;
                    }
                    pBVar59 = pBVar46;
                    if (pBVar22 != (BrotliEncoderParams *)0x0) {
                      pBVar59 = (BrotliEncoderParams *)
                                ((long)(pBVar22->dictionary).contextual.dict +
                                (long)(pBVar46[-1].dictionary.contextual.dict + 1));
                      pBVar52 = (BrotliEncoderParams *)0x0;
                      do {
                        if (*(char *)((long)(pBVar52->dictionary).contextual.dict +
                                     (long)(pBVar46[-1].dictionary.contextual.dict + 1)) !=
                            *(char *)((long)puVar38 + (long)pBVar52)) {
                          pBVar59 = (BrotliEncoderParams *)
                                    ((long)(pBVar52->dictionary).contextual.dict +
                                    (long)(pBVar46[-1].dictionary.contextual.dict + 1));
                          break;
                        }
                        pBVar52 = (BrotliEncoderParams *)((long)&pBVar52->mode + 1);
                      } while (pBVar22 != pBVar52);
                    }
                    pBVar59 = (BrotliEncoderParams *)((long)pBVar59 - (long)pBVar48);
LAB_0030a2af:
                    if ((BrotliEncoderParams *)0x3 < pBVar59) {
                      iVar27 = 0x1f;
                      if ((uint)pBVar29 != 0) {
                        for (; (uint)pBVar29 >> iVar27 == 0; iVar27 = iVar27 + -1) {
                        }
                      }
                      pBVar22 = (BrotliEncoderParams *)
                                ((ulong)(iVar27 * -0x1e + 0x780) + (long)pBVar59 * 0x87);
                      if (local_100 < pBVar22) {
                        iVar41 = 0;
                        pBVar39 = pBVar59;
                        local_148 = pBVar59;
                        local_140 = pBVar29;
                        local_100 = pBVar22;
                      }
                    }
                  }
                  puVar43 = puVar43 + 1;
                } while (-1 < (int)uVar26);
              }
              sVar60 = sVar60 + 1;
            } while (sVar60 != sVar58);
          }
          if (local_100 <
              (BrotliEncoderParams *)((long)(local_118->dictionary).compound.chunks + 0x47)) {
            bVar61 = false;
            local_140 = local_e0;
            pBVar28 = pBVar24;
            iVar27 = iVar62;
            iVar41 = iVar35;
          }
          else {
            local_130 = local_130 + 1;
            iVar27 = iVar62 + 1;
            bVar61 = iVar62 < 3 && (undefined1 *)((long)&pBVar24->quality + 1U) < puVar2;
            local_120 = local_148;
            local_118 = local_100;
          }
          local_e0 = local_140;
          pBVar24 = pBVar28;
          iVar62 = iVar27;
          iVar35 = iVar41;
        } while (bVar61);
        pBVar59 = (BrotliEncoderParams *)
                  ((long)(pBVar28->dictionary).compound.chunks + (sVar4 - 0x68));
        if (pBVar36 <= pBVar59) {
          pBVar59 = pBVar36;
        }
        pBVar59 = (BrotliEncoderParams *)
                  ((long)(pBVar59->dictionary).compound.chunks + (sVar5 - 0x68));
        if (pBVar59 < local_140) {
LAB_0030aa3b:
          puVar23 = (undefined1 *)((long)&local_140->lgblock + 3);
        }
        else {
          uVar26 = 0;
          bVar61 = false;
          if (local_140 != (BrotliEncoderParams *)(long)*dist_cache) {
            if (local_140 == (BrotliEncoderParams *)(long)dist_cache[1]) {
              uVar26 = 1;
            }
            else {
              uVar42 = (long)local_140 + (3 - (long)*dist_cache);
              if (uVar42 < 7) {
                bVar25 = (byte)((int)uVar42 << 2);
                uVar26 = 0x9750468;
              }
              else {
                uVar42 = (long)local_140 + (3 - (long)dist_cache[1]);
                if (6 < uVar42) {
                  if (local_140 != (BrotliEncoderParams *)(long)dist_cache[2]) {
                    bVar61 = local_140 != (BrotliEncoderParams *)(long)dist_cache[3];
                    uVar26 = 3;
                    goto LAB_0030aa34;
                  }
                  uVar26 = 2;
                  goto LAB_0030aa32;
                }
                bVar25 = (byte)((int)uVar42 << 2);
                uVar26 = 0xfdb1ace;
              }
              uVar26 = uVar26 >> (bVar25 & 0x1f) & 0xf;
            }
LAB_0030aa32:
            bVar61 = false;
          }
LAB_0030aa34:
          if (bVar61) goto LAB_0030aa3b;
          puVar23 = (undefined1 *)(ulong)uVar26;
        }
        if ((local_140 <= pBVar59) && (puVar23 != (undefined1 *)0x0)) {
          dist_cache[3] = dist_cache[2];
          uVar12 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar12;
          iVar35 = (int)local_140;
          *dist_cache = iVar35;
          dist_cache[4] = iVar35 + -1;
          dist_cache[5] = iVar35 + 1;
          dist_cache[6] = iVar35 + -2;
          dist_cache[7] = iVar35 + 2;
          dist_cache[8] = iVar35 + -3;
          dist_cache[9] = iVar35 + 3;
          iVar35 = (int)uVar12;
          dist_cache[10] = iVar35 + -1;
          dist_cache[0xb] = iVar35 + 1;
          dist_cache[0xc] = iVar35 + -2;
          dist_cache[0xd] = iVar35 + 2;
          *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar35 + 3,iVar35 + -3);
        }
        uVar26 = (uint)local_130;
        local_d0->insert_len_ = uVar26;
        local_d0->copy_len_ = iVar41 << 0x19 | (uint)local_120;
        uVar42 = (ulong)(params->dist).num_direct_distance_codes;
        puVar50 = (undefined1 *)(uVar42 + 0x10);
        if (puVar23 < puVar50) {
          local_d0->dist_prefix_ = (uint16_t)puVar23;
          uVar17 = 0;
        }
        else {
          uVar17 = (params->dist).distance_postfix_bits;
          bVar25 = (byte)uVar17;
          puVar23 = puVar23 + ((4L << (bVar25 & 0x3f)) - uVar42) + -0x10;
          uVar51 = 0x1f;
          if ((uint)puVar23 != 0) {
            for (; (uint)puVar23 >> uVar51 == 0; uVar51 = uVar51 - 1) {
            }
          }
          uVar51 = (uVar51 ^ 0xffffffe0) + 0x1f;
          bVar61 = ((ulong)puVar23 >> ((ulong)uVar51 & 0x3f) & 1) != 0;
          local_148 = (BrotliEncoderParams *)((ulong)bVar61 + 2 << ((byte)uVar51 & 0x3f));
          iVar35 = uVar51 - uVar17;
          local_d0->dist_prefix_ =
               (short)((uint)bVar61 + iVar35 * 2 + 0xfffe << (bVar25 & 0x3f)) +
               (short)puVar50 + (~(ushort)(-1 << (bVar25 & 0x1f)) & (ushort)puVar23) |
               (short)iVar35 * 0x400;
          uVar17 = (uint32_t)((ulong)((long)puVar23 - (long)local_148) >> (bVar25 & 0x3f));
        }
        local_d0->dist_extra_ = uVar17;
        if (5 < local_130) {
          if (local_130 < 0x82) {
            uVar26 = 0x1f;
            uVar51 = (uint)(local_130 - 2);
            if (uVar51 != 0) {
              for (; uVar51 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            uVar26 = (int)(local_130 - 2 >> ((char)(uVar26 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar26 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_130 < 0x842) {
            uVar51 = 0x1f;
            if (uVar26 - 0x42 != 0) {
              for (; uVar26 - 0x42 >> uVar51 == 0; uVar51 = uVar51 - 1) {
              }
            }
            uVar26 = (uVar51 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar26 = 0x15;
            if (0x1841 < local_130) {
              uVar26 = (uint)(ushort)(0x17 - (local_130 < 0x5842));
            }
          }
        }
        uVar51 = iVar41 + (uint)local_120;
        if (uVar51 < 10) {
          uVar16 = uVar51 - 2;
        }
        else if (uVar51 < 0x86) {
          uVar51 = uVar51 - 6;
          uVar16 = 0x1f;
          if (uVar51 != 0) {
            for (; uVar51 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          uVar16 = (int)((ulong)(long)(int)uVar51 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar16 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar16 = 0x17;
          if (uVar51 < 0x846) {
            uVar16 = 0x1f;
            if (uVar51 - 0x46 != 0) {
              for (; uVar51 - 0x46 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            uVar16 = (uVar16 ^ 0xffe0) + 0x2c;
          }
        }
        uVar3 = (ushort)uVar16;
        uVar40 = (uVar3 & 7) + ((ushort)uVar26 & 7) * 8;
        if ((((local_d0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar26 < 8)) && (uVar3 < 0x10)) {
          if (7 < uVar3) {
            uVar40 = uVar40 + 0x40;
          }
        }
        else {
          iVar35 = ((uVar26 & 0xffff) >> 3) * 3 + ((uVar16 & 0xffff) >> 3);
          uVar40 = uVar40 + ((ushort)(0x520d40 >> ((char)iVar35 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar35 * 0x40 + 0x40;
        }
        local_d0->cmd_prefix_ = uVar40;
        *num_literals = *num_literals + local_130;
        position = (long)(local_120->dictionary).contextual.dict +
                   (long)(pBVar28[-1].dictionary.contextual.dict + 1);
        pBVar24 = pBVar18;
        if (position < pBVar18) {
          pBVar24 = (BrotliEncoderParams *)position;
        }
        pBVar48 = (BrotliEncoderParams *)((long)&pBVar28->mode + 2);
        if (local_140 < (BrotliEncoderParams *)((ulong)local_120 >> 2)) {
          pBVar59 = (BrotliEncoderParams *)(position + (long)local_140 * -4);
          if (pBVar59 < pBVar48) {
            pBVar59 = pBVar48;
          }
          pBVar48 = pBVar59;
          if (pBVar24 < pBVar59) {
            pBVar48 = pBVar24;
          }
        }
        pBVar59 = (BrotliEncoderParams *)
                  ((long)(pBVar28->dictionary).compound.chunks +
                  lVar49 + (long)local_120 * 2 + -0x68);
        local_d0 = local_d0 + 1;
        if (pBVar48 < pBVar24) {
          pvVar7 = (hasher->privat)._H42.extra[0];
          pvVar10 = (hasher->privat)._H42.extra[1];
          do {
            uVar26 = (uint)(*(int *)(ringbuffer + ((ulong)pBVar48 & ringbuffer_mask)) * 0x1e35a7bd)
                     >> 0x11;
            uVar21 = (ulong)uVar26;
            uVar16 = uVar26 & 0x1ff;
            uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2);
            *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2) = uVar3 + 1;
            uVar51 = uVar3 & 0x1ff;
            local_148 = (BrotliEncoderParams *)(ulong)uVar51;
            uVar42 = (long)pBVar48 - (ulong)*(uint *)((long)pvVar7 + uVar21 * 4);
            *(char *)((long)pvVar7 + ((ulong)pBVar48 & 0xffff) + 0x30000) = (char)uVar26;
            if (0xfffe < uVar42) {
              uVar42 = 0xffff;
            }
            *(short *)((long)pvVar10 + (ulong)uVar51 * 4 + (ulong)(uVar16 << 0xb)) = (short)uVar42;
            *(undefined2 *)((long)pvVar10 + (ulong)uVar51 * 4 + (ulong)(uVar16 << 0xb) + 2) =
                 *(undefined2 *)((long)pvVar7 + uVar21 * 2 + 0x20000);
            *(int *)((long)pvVar7 + uVar21 * 4) = (int)pBVar48;
            *(short *)((long)pvVar7 + uVar21 * 2 + 0x20000) = (short)uVar51;
            pBVar48 = (BrotliEncoderParams *)((long)&pBVar48->mode + 1);
          } while (pBVar24 != pBVar48);
          local_130 = 0;
        }
        else {
          local_130 = 0;
        }
      }
      pBVar24 = (BrotliEncoderParams *)position;
    } while (&((BrotliEncoderParams *)position)->quality < puVar2);
  }
  else {
    local_d0 = commands;
  }
  *last_insert_len = (size_t)(puVar2 + (local_130 - position));
  *num_commands = *num_commands + ((long)local_d0 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}